

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall
QDateTimeEditPrivate::editorCursorPositionChanged(QDateTimeEditPrivate *this,int oldpos,int newpos)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  qsizetype qVar6;
  int *piVar7;
  QLineEdit *this_00;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  int closest;
  int l;
  int selSection;
  int selstart;
  int c;
  int s;
  bool forward;
  bool allowChange;
  QString oldText;
  undefined8 in_stack_ffffffffffffff48;
  int iVar8;
  QAbstractSpinBoxPrivate *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int iVar9;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  uint uVar10;
  undefined4 in_stack_ffffffffffffff64;
  bool local_95;
  int local_94;
  int in_stack_ffffffffffffff78;
  undefined1 forward_00;
  uint in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_70;
  long *plVar11;
  QDateTimeEditPrivate *in_stack_ffffffffffffffa8;
  int local_40 [2];
  QString local_38;
  QString local_20;
  long local_8;
  
  iVar8 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(ushort *)(in_RDI + 0x7a) >> 3 & 1) == 0) &&
     (plVar11 = in_RDI, bVar1 = QAbstractSpinBoxPrivate::specialValue(in_stack_ffffffffffffff50),
     !bVar1)) {
    local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*in_RDI + 0x110))(&local_20);
    updateCache((QDateTimeEditPrivate *)
                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                (QVariant *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                (QString *)in_stack_ffffffffffffff50);
    bVar1 = QLineEdit::hasSelectedText((QLineEdit *)in_stack_ffffffffffffff50);
    bVar2 = (bVar1 ^ 0xffU) & 1;
    *(ushort *)(in_RDI + 0x7a) = *(ushort *)(in_RDI + 0x7a) & 0xfff7 | 8;
    local_70 = sectionAt((QDateTimeEditPrivate *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff84);
    if ((local_70 == -1) && ((in_ESI <= in_EDX && (0 < in_EDX)))) {
      local_70 = sectionAt((QDateTimeEditPrivate *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           in_stack_ffffffffffffff84);
    }
    iVar5 = in_EDX;
    iVar3 = QLineEdit::selectionStart((QLineEdit *)in_stack_ffffffffffffff50);
    iVar4 = sectionAt((QDateTimeEditPrivate *)CONCAT44(iVar5,iVar3),in_stack_ffffffffffffff84);
    iVar9 = (int)in_RDI;
    if (iVar4 == -1) {
      local_94 = 0;
    }
    else {
      local_94 = QDateTimeParser::sectionSize(iVar9 + 0x3d8);
    }
    forward_00 = (undefined1)((uint)in_stack_ffffffffffffff78 >> 0x18);
    if (local_70 == -1) {
      in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c & 0xffffff;
      local_95 = false;
      local_70 = iVar4;
      if (0 < local_94) {
        iVar5 = QDateTimeParser::sectionPos(iVar9 + 0x3d8);
        local_95 = false;
        local_70 = iVar4;
        if (iVar3 == iVar5) {
          QLineEdit::selectedText
                    ((QLineEdit *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          in_stack_ffffffffffffff7c = CONCAT13(1,(int3)in_stack_ffffffffffffff7c);
          qVar6 = QString::size(&local_38);
          local_95 = qVar6 == local_94;
          local_70 = iVar4;
        }
      }
      uVar10 = (uint)local_95 << 0x18;
      if ((in_stack_ffffffffffffff7c & 0x1000000) != 0) {
        QString::~QString((QString *)0x5615cf);
      }
      if ((uVar10 & 0x1000000) == 0) {
        in_stack_ffffffffffffff78 =
             closestSection(in_stack_ffffffffffffffa8,(int)((ulong)plVar11 >> 0x20),
                            SUB81((ulong)plVar11 >> 0x18,0));
        iVar5 = QDateTimeParser::sectionPos(iVar9 + 0x3d8);
        if (in_ESI <= in_EDX) {
          iVar9 = 0;
          iVar4 = local_70;
        }
        else {
          local_40[1] = 0;
          local_40[0] = QDateTimeParser::sectionSize(iVar9 + 0x3d8);
          piVar7 = qMax<int>(local_40 + 1,local_40);
          iVar9 = *piVar7;
          iVar4 = local_70;
        }
        iVar5 = iVar5 + iVar9;
        local_70 = in_stack_ffffffffffffff78;
        if (bVar2 != 0) {
          QLineEdit::setCursorPosition((QLineEdit *)in_stack_ffffffffffffff50,iVar8);
          local_70 = in_stack_ffffffffffffff78;
        }
      }
      else {
        iVar4 = local_70;
        if (bVar2 != 0) {
          setSelected((QDateTimeEditPrivate *)CONCAT44(local_70,local_94),in_stack_ffffffffffffff7c,
                      SUB41((uint)in_stack_ffffffffffffff78 >> 0x18,0));
        }
        iVar5 = -1;
      }
      forward_00 = (undefined1)((uint)in_stack_ffffffffffffff78 >> 0x18);
    }
    if ((bVar2 != 0) && ((int)in_RDI[0x7c] != local_70)) {
      (**(code **)(*in_RDI + 0xd0))(in_RDI,0);
    }
    if (iVar5 == -1) {
      setSelected((QDateTimeEditPrivate *)CONCAT44(iVar4,local_94),in_stack_ffffffffffffff7c,
                  (bool)forward_00);
    }
    else {
      bVar1 = QLineEdit::hasSelectedText((QLineEdit *)in_stack_ffffffffffffff50);
      if (!bVar1) {
        if (in_ESI < in_EDX) {
          iVar8 = (int)((ulong)in_RDI[0x6f] >> 0x20);
          (**(code **)(*in_RDI + 0x110))(&stack0xffffffffffffffa8);
          this_00 = (QLineEdit *)QString::size((QString *)&stack0xffffffffffffffa8);
          QString::size(&local_20);
          QLineEdit::setCursorPosition(this_00,iVar8);
          QString::~QString((QString *)0x561781);
        }
        else {
          QLineEdit::setCursorPosition((QLineEdit *)in_stack_ffffffffffffff50,iVar8);
        }
      }
    }
    *(int *)(in_RDI + 0x7c) = local_70;
    *(ushort *)(in_RDI + 0x7a) = *(ushort *)(in_RDI + 0x7a) & 0xfff7;
    QString::~QString((QString *)0x5617ce);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEditPrivate::editorCursorPositionChanged(int oldpos, int newpos)
{
    if (ignoreCursorPositionChanged || specialValue())
        return;
    const QString oldText = displayText();
    updateCache(value, oldText);

    const bool allowChange = !edit->hasSelectedText();
    const bool forward = oldpos <= newpos;
    ignoreCursorPositionChanged = true;
    int s = sectionAt(newpos);
    if (s == NoSectionIndex && forward && newpos > 0) {
        s = sectionAt(newpos - 1);
    }

    int c = newpos;

    const int selstart = edit->selectionStart();
    const int selSection = sectionAt(selstart);
    const int l = selSection != -1 ? sectionSize(selSection) : 0;

    if (s == NoSectionIndex) {
        if (l > 0 && selstart == sectionPos(selSection) && edit->selectedText().size() == l) {
            s = selSection;
            if (allowChange)
                setSelected(selSection, true);
            c = -1;
        } else {
            int closest = closestSection(newpos, forward);
            c = sectionPos(closest) + (forward ? 0 : qMax<int>(0, sectionSize(closest)));

            if (allowChange) {
                edit->setCursorPosition(c);
                QDTEDEBUG << c;
            }
            s = closest;
        }
    }

    if (allowChange && currentSectionIndex != s) {
        interpret(EmitIfChanged);
    }
    if (c == -1) {
        setSelected(s, true);
    } else if (!edit->hasSelectedText()) {
        if (oldpos < newpos) {
            edit->setCursorPosition(displayText().size() - (oldText.size() - c));
        } else {
            edit->setCursorPosition(c);
        }
    }

    QDTEDEBUG << "currentSectionIndex is set to" << sectionNode(s).name()
              << oldpos << newpos
              << "was" << sectionNode(currentSectionIndex).name();

    currentSectionIndex = s;
    Q_ASSERT_X(currentSectionIndex < sectionNodes.size(),
               "QDateTimeEditPrivate::editorCursorPositionChanged()",
               qPrintable(QString::fromLatin1("Internal error (%1 %2)").
                          arg(currentSectionIndex).
                          arg(sectionNodes.size())));

    ignoreCursorPositionChanged = false;
}